

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

iteration_time __thiscall
helics::FederateState::enterExecutingMode
          (FederateState *this,IterationRequest iterate,bool sendRequest)

{
  Time TVar1;
  byte bVar2;
  bool bVar3;
  FederateStates FVar4;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  undefined1 in_SIL;
  FederateState *in_RDI;
  undefined1 auVar6 [16];
  iteration_time iVar7;
  iteration_time iVar8;
  IterationResult ret;
  lock_guard<helics::FederateState> plock;
  FederateState *in_stack_00000048;
  MessageProcessingResult ret_1;
  ActionMessage exec;
  undefined7 in_stack_fffffffffffffe98;
  IterationRequest in_stack_fffffffffffffe9f;
  FederateState *in_stack_fffffffffffffea0;
  atomic<bool> *in_stack_fffffffffffffea8;
  action_t in_stack_fffffffffffffebc;
  ActionMessage *in_stack_fffffffffffffec0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed8;
  undefined2 uVar9;
  FederateState *in_stack_fffffffffffffee0;
  GlobalFederateId local_d0;
  undefined1 in_stack_ffffffffffffffde;
  IterationRequest in_stack_ffffffffffffffdf;
  undefined6 in_stack_ffffffffffffffe0;
  Time local_10;
  IterationResult local_8;
  
  uVar9 = (undefined2)((ulong)in_stack_fffffffffffffed8 >> 0x30);
  bVar2 = in_DL & 1;
  bVar3 = try_lock(in_RDI);
  if (bVar3) {
    if ((bVar2 & 1) != 0) {
      ActionMessage::ActionMessage(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      local_d0 = std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
      setIterationFlags((ActionMessage *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                ((ActionMessage *)&stack0xffffffffffffff28,indicator_flag);
      addAction(in_stack_fffffffffffffea0,
                (ActionMessage *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffea0);
    }
    local_8 = processQueue(in_stack_00000048);
    updateDataForExecEntry
              (in_stack_fffffffffffffee0,(MessageProcessingResult)((ushort)uVar9 >> 8),
               (IterationRequest)uVar9);
    unlock(in_stack_fffffffffffffea0);
    if (((in_RDI->realtime & 1U) == 0) || (local_8 != NEXT_STEP)) {
      bVar3 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&in_RDI->grantTimeOutPeriod,
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      uVar5 = extraout_RDX;
      if ((bVar3) &&
         (bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->mTimer),
         uVar5 = extraout_RDX_00, !bVar3)) {
        std::
        make_shared<helics::MessageTimer,helics::FederateState::enterExecutingMode(helics::IterationRequest,bool)::__1>
                  (in_stack_fffffffffffffec8);
        std::shared_ptr<helics::MessageTimer>::operator=
                  ((shared_ptr<helics::MessageTimer> *)in_stack_fffffffffffffea0,
                   (shared_ptr<helics::MessageTimer> *)
                   CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        std::shared_ptr<helics::MessageTimer>::~shared_ptr
                  ((shared_ptr<helics::MessageTimer> *)0x58df37);
        uVar5 = extraout_RDX_01;
      }
    }
    else {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->mTimer);
      if (!bVar3) {
        std::
        make_shared<helics::MessageTimer,helics::FederateState::enterExecutingMode(helics::IterationRequest,bool)::__0>
                  (in_stack_fffffffffffffec8);
        std::shared_ptr<helics::MessageTimer>::operator=
                  ((shared_ptr<helics::MessageTimer> *)in_stack_fffffffffffffea0,
                   (shared_ptr<helics::MessageTimer> *)
                   CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        std::shared_ptr<helics::MessageTimer>::~shared_ptr
                  ((shared_ptr<helics::MessageTimer> *)0x58deab);
      }
      auVar6 = std::chrono::_V2::steady_clock::now();
      uVar5 = auVar6._8_8_;
      (in_RDI->start_clock_time).__d.__r = auVar6._0_8_;
    }
    iVar7._8_8_ = uVar5;
    iVar7.grantedTime.internalTimeCode = (in_RDI->time_granted).internalTimeCode;
  }
  else {
    bVar3 = CLI::std::atomic<bool>::load
                      (in_stack_fffffffffffffea8,
                       (memory_order)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    if (!bVar3) {
      CLI::std::this_thread::yield();
      bVar3 = CLI::std::atomic<bool>::load
                        (in_stack_fffffffffffffea8,
                         (memory_order)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      if (!bVar3) {
        iVar7 = enterExecutingMode((FederateState *)
                                   CONCAT17(in_SIL,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                                   in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
        local_8 = iVar7.state;
        goto LAB_0058e05c;
      }
    }
    std::lock_guard<helics::FederateState>::lock_guard
              ((lock_guard<helics::FederateState> *)in_stack_fffffffffffffea0,
               (mutex_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    FVar4 = getState((FederateState *)0x58dff6);
    switch(FVar4) {
    case CREATED:
    case INITIALIZING:
    default:
      local_8 = ITERATING;
      break;
    case EXECUTING:
      local_8 = NEXT_STEP;
      break;
    case ERRORED:
      local_8 = ERROR_RESULT;
      break;
    case FINISHED:
      local_8 = HALTED;
    }
    TVar1.internalTimeCode = (in_RDI->time_granted).internalTimeCode;
    std::lock_guard<helics::FederateState>::~lock_guard
              ((lock_guard<helics::FederateState> *)0x58e05c);
    iVar7._8_8_ = extraout_RDX_02;
    iVar7.grantedTime.internalTimeCode = TVar1.internalTimeCode;
  }
LAB_0058e05c:
  local_10 = iVar7.grantedTime.internalTimeCode;
  iVar8._9_7_ = iVar7._9_7_;
  iVar8.state = local_8;
  iVar8.grantedTime.internalTimeCode = local_10.internalTimeCode;
  return iVar8;
}

Assistant:

iteration_time FederateState::enterExecutingMode(IterationRequest iterate, bool sendRequest)
{
    if (try_lock()) {  // only enter this loop once per federate
        // timeCoord->enteringExecMode (iterate);
        if (sendRequest) {
            ActionMessage exec(CMD_EXEC_REQUEST);
            exec.source_id = global_id.load();
            setIterationFlags(exec, iterate);
            setActionFlag(exec, indicator_flag);
            addAction(exec);
        }

        auto ret = processQueue();
        updateDataForExecEntry(ret, iterate);
        unlock();
#ifndef HELICS_DISABLE_ASIO
        if ((realtime) && (ret == MessageProcessingResult::NEXT_STEP)) {
            if (!mTimer) {
                mTimer = std::make_shared<MessageTimer>(
                    [this](ActionMessage&& mess) { return this->addAction(std::move(mess)); });
            }
            start_clock_time = std::chrono::steady_clock::now();
        } else if (grantTimeOutPeriod > timeZero) {
            if (!mTimer) {
                mTimer = std::make_shared<MessageTimer>(
                    [this](ActionMessage&& mess) { return this->addAction(std::move(mess)); });
            }
        }
#endif
        return {time_granted, static_cast<IterationResult>(ret)};
    }

    // if this is not true then try again the core may have been handing something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return enterExecutingMode(iterate, sendRequest);
        }
    }

    // the following code is for a situation in which this method has been called multiple times
    // from different threads, which really shouldn't be done but it isn't really an error so we
    // need to deal with it.
    const std::lock_guard<FederateState> plock(*this);
    IterationResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        case FederateStates::CREATED:
        case FederateStates::INITIALIZING:
        default:
            ret = IterationResult::ITERATING;
            break;
        case FederateStates::EXECUTING:
            ret = IterationResult::NEXT_STEP;
            break;
    }
    return {time_granted, ret};
}